

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_property.c
# Opt level: O1

int mpt_world_set(mpt_world *wld,char *name,mpt_convertable *src)

{
  mpt_color *pmVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  mpt_lineattr *pmVar8;
  mpt_world *from;
  undefined8 *local_30;
  
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      return -4;
    }
    iVar5 = mpt_world_pointer_typeid::ptype;
    if ((mpt_world_pointer_typeid::ptype == 0) &&
       (iVar5 = mpt_type_add(&mpt_world_pointer_typeid::traits), 0 < iVar5)) {
      mpt_world_pointer_typeid::ptype = iVar5;
    }
    if ((iVar5 < 1) || (iVar5 = (*src->_vptr->convert)(src,(mpt_type_t)iVar5,&local_30), iVar5 < 0))
    {
      iVar5 = mpt_string_pset(&wld->_alias,src);
      if (-1 < iVar5) {
        return iVar5;
      }
      iVar5 = mpt_color_typeid();
      if (0 < iVar5) {
        pmVar1 = &wld->color;
        iVar5 = (*src->_vptr->convert)(src,(mpt_type_t)iVar5,pmVar1);
        if (-1 < iVar5) {
          if (iVar5 == 0) {
            pmVar1->alpha = 0xff;
            pmVar1->red = '\0';
            pmVar1->green = '\0';
            pmVar1->blue = '\0';
            return 0;
          }
          return 0;
        }
      }
      iVar5 = mpt_lattr_typeid();
      if (iVar5 < 1) {
        return -3;
      }
      pmVar8 = &wld->attr;
      iVar5 = (*src->_vptr->convert)(src,(mpt_type_t)iVar5,pmVar8);
      if (iVar5 < 0) {
        return -3;
      }
      if (iVar5 == 0) {
        pmVar8->style = '\x01';
        pmVar8->width = '\x01';
        pmVar8->symbol = '\0';
        pmVar8->size = '\n';
        return 0;
      }
      return 0;
    }
  }
  else {
    if (*name != '\0') {
      iVar5 = strcasecmp(name,"cyc");
      if ((iVar5 == 0) || (iVar5 = strcasecmp(name,"cycles"), iVar5 == 0)) {
        if ((src != (mpt_convertable *)0x0) &&
           (uVar6 = (*src->_vptr->convert)(src,0x75,&wld->cyc), uVar6 != 0)) {
          return (int)uVar6 >> 0x1f & uVar6;
        }
      }
      else {
        iVar5 = strcasecmp(name,"color");
        if ((iVar5 != 0) && (iVar5 = strcasecmp(name,"colour"), iVar5 != 0)) {
          iVar5 = strcasecmp(name,"alias");
          if (iVar5 == 0) {
            if (src != (mpt_convertable *)0x0) {
              iVar5 = mpt_string_pset(&wld->_alias,src);
              return iVar5;
            }
            mpt_string_set(&wld->_alias,(char *)0x0,0);
            return 0;
          }
          iVar5 = strcasecmp(name,"width");
          if (iVar5 == 0) {
            if (src == (mpt_convertable *)0x0) {
              (wld->attr).width = '\x01';
              return 0;
            }
            iVar5 = mpt_lattr_width(&wld->attr,src);
            return iVar5;
          }
          iVar5 = strcasecmp(name,"style");
          if (iVar5 == 0) {
            if (src == (mpt_convertable *)0x0) {
              (wld->attr).style = '\x01';
              return 0;
            }
            iVar5 = mpt_lattr_style(&wld->attr,src);
            return iVar5;
          }
          iVar5 = strcasecmp(name,"sym");
          if ((iVar5 != 0) && (iVar5 = strcasecmp(name,"symbol"), iVar5 != 0)) {
            iVar5 = strcasecmp(name,"size");
            if (iVar5 != 0) {
              return -1;
            }
            if (src == (mpt_convertable *)0x0) {
              (wld->attr).size = '\n';
              return 0;
            }
            iVar5 = mpt_lattr_size(&wld->attr,src);
            return iVar5;
          }
          if (src == (mpt_convertable *)0x0) {
            (wld->attr).symbol = '\0';
            return 0;
          }
          iVar5 = mpt_lattr_symbol(&wld->attr,src);
          return iVar5;
        }
        if (src != (mpt_convertable *)0x0) {
          iVar5 = mpt_color_pset(&wld->color,src);
          return iVar5;
        }
      }
      wld->cyc = 0;
      return 0;
    }
    if (src == (mpt_convertable *)0x0) {
      free(wld->_alias);
      wld->cyc = 0;
      *(undefined4 *)&wld->field_0x14 = 0;
      goto LAB_00107fd6;
    }
    iVar5 = mpt_world_pointer_typeid::ptype;
    if ((mpt_world_pointer_typeid::ptype == 0) &&
       (iVar5 = mpt_type_add(&mpt_world_pointer_typeid::traits), 0 < iVar5)) {
      mpt_world_pointer_typeid::ptype = iVar5;
    }
    if (iVar5 < 1) {
      return -3;
    }
    iVar5 = (*src->_vptr->convert)(src,(mpt_type_t)iVar5,&local_30);
    if (iVar5 < 0) {
      return -3;
    }
  }
  free(wld->_alias);
  wld->cyc = 0;
  *(undefined4 *)&wld->field_0x14 = 0;
  *(undefined4 *)&wld->_alias = 0;
  *(undefined4 *)((long)&wld->_alias + 4) = 0;
  (wld->color).alpha = 0xff;
  (wld->color).red = '\0';
  (wld->color).green = '\0';
  (wld->color).blue = '\0';
  (wld->attr).style = '\x01';
  (wld->attr).width = '\x01';
  (wld->attr).symbol = '\0';
  (wld->attr).size = '\n';
  if (local_30 != (undefined8 *)0x0 && iVar5 != 0) {
    uVar3 = local_30[1];
    wld->_alias = (char *)*local_30;
    uVar2 = (undefined4)uVar3;
    uVar4 = (undefined4)((ulong)uVar3 >> 0x20);
    (wld->color).alpha = (char)uVar2;
    (wld->color).red = (char)((uint)uVar2 >> 8);
    (wld->color).green = (char)((uint)uVar2 >> 0x10);
    (wld->color).blue = (char)((uint)uVar2 >> 0x18);
    (wld->attr).style = (char)uVar4;
    (wld->attr).width = (char)((uint)uVar4 >> 8);
    (wld->attr).symbol = (char)((uint)uVar4 >> 0x10);
    (wld->attr).size = (char)((uint)uVar4 >> 0x18);
    *(undefined8 *)&wld->cyc = local_30[2];
    if (wld->_alias != (char *)0x0) {
      pcVar7 = strdup(wld->_alias);
      wld->_alias = pcVar7;
      return 0;
    }
    return 0;
  }
  wld->cyc = 0;
  *(undefined4 *)&wld->field_0x14 = 0;
LAB_00107fd6:
  *(undefined4 *)&wld->_alias = 0;
  *(undefined4 *)((long)&wld->_alias + 4) = 0;
  (wld->color).alpha = 0xff;
  (wld->color).red = '\0';
  (wld->color).green = '\0';
  (wld->color).blue = '\0';
  (wld->attr).style = '\x01';
  (wld->attr).width = '\x01';
  (wld->attr).symbol = '\0';
  (wld->attr).size = '\n';
  return 0;
}

Assistant:

extern int mpt_world_set(MPT_STRUCT(world) *wld, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	if (!name) {
		const MPT_STRUCT(world) *from;
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_world_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_world_fini(wld);
			mpt_world_init(wld, len ? from : 0);
			return 0;
		}
		if ((len = mpt_string_pset(&wld->_alias, src)) >= 0) {
			return len;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &wld->color)) >= 0) {
			if (!len) wld->color = def_world.color;
			return 0;
		}
		if ((type = mpt_lattr_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &wld->attr)) >= 0) {
			if (!len) wld->attr = def_world.attr;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		const MPT_STRUCT(world) *from;
		int type;
		
		if (!src) {
			mpt_world_fini(wld);
			return 0;
		}
		if ((type = mpt_world_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_world_fini(wld);
			mpt_world_init(wld, len ? from : 0);
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	if (!strcasecmp(name, "cyc") || !strcasecmp(name, "cycles")) {
		if (!src || !(len = src->_vptr->convert(src, 'u', &wld->cyc))) {
			wld->cyc = def_world.cyc;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "color") || !strcasecmp(name, "colour")) {
		if (!src) {
			wld->cyc = def_world.cyc;
			return 0;
		}
		return mpt_color_pset(&wld->color, src);
	}
	if (!strcasecmp(name, "alias")) {
		if (!src) {
			mpt_string_set(&wld->_alias, 0, 0);
			return 0;
		}
		return mpt_string_pset(&wld->_alias, src);
	}
	if (!strcasecmp(name, "width")) {
		if (!src) {
			wld->attr.width = def_world.attr.width;
			return 0;
		}
		return mpt_lattr_width(&wld->attr, src);
	}
	if (!strcasecmp(name, "style")) {
		if (!src) {
			wld->attr.style = def_world.attr.style;
			return 0;
		}
		return mpt_lattr_style(&wld->attr, src);
	}
	if (!strcasecmp(name, "sym") || !strcasecmp(name, "symbol")) {
		if (!src) {
			wld->attr.symbol = def_world.attr.symbol;
			return 0;
		}
		return mpt_lattr_symbol(&wld->attr, src);
	}
	if (!strcasecmp(name, "size")) {
		if (!src) {
			wld->attr.size = def_world.attr.size;
			return 0;
		}
		return mpt_lattr_size(&wld->attr, src);
	}
	return MPT_ERROR(BadArgument);
}